

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

BVec4 __thiscall tcu::getTextureFormatChannelMask(tcu *this,TextureFormat *format)

{
  deBool dVar1;
  deBool dVar2;
  deBool dVar3;
  deBool dVar4;
  TextureSwizzle *pTVar5;
  Channel *map;
  TextureFormat *format_local;
  
  pTVar5 = getChannelReadSwizzle(format->order);
  dVar1 = ::deInRange32(pTVar5->components[0],0,3);
  dVar2 = ::deInRange32(pTVar5->components[1],0,3);
  dVar3 = ::deInRange32(pTVar5->components[2],0,3);
  dVar4 = ::deInRange32(pTVar5->components[3],0,3);
  Vector<bool,_4>::Vector((Vector<bool,_4> *)this,dVar1 == 1,dVar2 == 1,dVar3 == 1,dVar4 == 1);
  return (BVec4)SUB84(this,0);
}

Assistant:

BVec4 getTextureFormatChannelMask (const TextureFormat& format)
{
	const TextureSwizzle::Channel* const map = getChannelReadSwizzle(format.order).components;
	return BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
				 deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
				 deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
				 deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
}